

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::IsClosed(ON_PolyCurve *this)

{
  ON_Curve *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar3 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if (iVar3 == 1) {
    pOVar1 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    if (pOVar1 != (ON_Curve *)0x0) {
      iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
      return SUB41(iVar3,0);
    }
  }
  else if ((1 < iVar3) && (bVar2 = ON_Curve::IsClosed(&this->super_ON_Curve), bVar2)) {
    iVar3 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
    iVar4 = 1;
    iVar5 = 1;
    if (1 < iVar3) {
      iVar5 = iVar3;
    }
    do {
      if (iVar5 == iVar4) {
        return iVar3 <= iVar4;
      }
      bVar2 = HasGapAt(this,iVar4 + -1);
      iVar4 = iVar4 + 1;
    } while (!bVar2);
  }
  return false;
}

Assistant:

bool 
ON_PolyCurve::IsClosed() const
{
  bool bIsClosed = false;
  const int count = Count();
  if ( count == 1 ) {
    // evaluation test required
    const ON_Curve* c = FirstSegmentCurve();
    if ( c )
      bIsClosed = c->IsClosed();
  }
  else if ( count > 1 ) 
  {
    // 17 May2005 Dale Lear 
    //  I added the FindNextGap(0) <= 0 test to
    //  prevent discontinuous curves from being
    //  classified as closed.
    bIsClosed = ( ON_Curve::IsClosed() && FindNextGap(0) <= 0 );
  }
  return bIsClosed;
}